

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base58.c
# Opt level: O0

void coda_base58_encode(char *in,size_t inlen,char *out,size_t outlen)

{
  undefined1 auVar1 [16];
  int iVar2;
  byte *__ptr;
  long in_RCX;
  char *in_RDX;
  long in_RSI;
  byte *in_RDI;
  bool bVar3;
  int i;
  uint carry;
  char *b58_curr;
  char *b58_begin;
  uint b58len;
  int local_40;
  uint local_3c;
  byte *local_38;
  uint local_24;
  long local_20;
  char *local_18;
  long local_10;
  byte *local_8;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  while( true ) {
    bVar3 = false;
    if ((local_20 != 0) && (bVar3 = false, local_10 != 0)) {
      bVar3 = *local_8 == 0;
    }
    if (!bVar3) break;
    *local_18 = '1';
    local_20 = local_20 + -1;
    local_8 = local_8 + 1;
    local_10 = local_10 + -1;
    local_18 = local_18 + 1;
  }
  auVar1._8_8_ = 0;
  auVar1._0_8_ = local_10 * 0x8a;
  iVar2 = SUB164(auVar1 / ZEXT816(100),0);
  local_24 = iVar2 + 1;
  __ptr = (byte *)calloc((ulong)local_24,1);
  for (; local_38 = __ptr, local_10 != 0; local_10 = local_10 + -1) {
    local_40 = iVar2;
    for (local_3c = (uint)*local_8; local_3c != 0 || -1 < local_40; local_3c = local_3c / 0x3a) {
      local_3c = (char)__ptr[local_40] * 0x100 + local_3c;
      __ptr[local_40] = (byte)((ulong)local_3c % 0x3a);
      local_40 = local_40 + -1;
    }
    local_8 = local_8 + 1;
  }
  while( true ) {
    bVar3 = false;
    if (local_24 != 0) {
      bVar3 = *local_38 == 0;
    }
    if (!bVar3) break;
    local_24 = local_24 - 1;
    local_38 = local_38 + 1;
  }
  for (; local_20 != 0 && local_24 != 0; local_20 = local_20 + -1) {
    *local_18 = "123456789ABCDEFGHJKLMNPQRSTUVWXYZabcdefghijkmnopqrstuvwxyz"[*local_38];
    local_24 = local_24 - 1;
    local_38 = local_38 + 1;
    local_18 = local_18 + 1;
  }
  if (local_20 != 0) {
    *local_18 = '\0';
  }
  free(__ptr);
  return;
}

Assistant:

void coda_base58_encode (const char* in, size_t inlen, char* out, size_t outlen)
{
    static const char b58str[58] = "123456789ABCDEFGHJKLMNPQRSTUVWXYZabcdefghijkmnopqrstuvwxyz";

    while (outlen && inlen && !*in)
    {
        *out++ = '1';
        outlen--;

        in++;
        inlen--;
    }

    unsigned b58len = inlen * 138 / 100 + 1; // log(256) / log(58), rounded up.
    char* b58_begin = NULL;
    char* b58_curr = NULL;
    b58_begin = b58_curr = (char*)calloc(b58len, sizeof(unsigned char));

    while (inlen)
    {
        unsigned int carry = (unsigned char)*in++;
        int i;
        for (i = b58len - 1; carry || i >= 0; i--)
        {
            carry += 256 * b58_curr[i];
            b58_curr[i] = carry % 58;
            carry /= 58;
        }
        inlen--;
    }

    // Skip leading zeroes in base58 result.
    while (b58len && !*b58_curr)
    {
        b58_curr++;
        b58len--;
    }

    while (outlen && b58len)
    {
        *out++ = b58str[(unsigned char)*b58_curr++];
        b58len--;
        outlen--;
    }

    if (outlen) *out = '\0';

    free(b58_begin);
}